

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.cpp
# Opt level: O0

QFunctionPointer anon_unknown.dwarf_173577e::getProcAddress(QOpenGLContext *context,char *funcName)

{
  size_t __n;
  char *in_RSI;
  long in_FS_OFFSET;
  anon_struct_16_2_62e3e2f5 *e;
  anon_struct_16_2_62e3e2f5 *__end2;
  anon_struct_16_2_62e3e2f5 *__begin2;
  anon_struct_16_2_62e3e2f5 (*__range2) [5];
  char *ext;
  size_t size;
  QFunctionPointer function;
  char fn [512];
  char *in_stack_fffffffffffffdb0;
  anon_struct_16_2_62e3e2f5 *procName;
  QOpenGLContext *in_stack_fffffffffffffdb8;
  anon_struct_16_2_62e3e2f5 *this;
  anon_struct_16_2_62e3e2f5 *local_240;
  QFunctionPointer local_220;
  undefined1 local_208 [512];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_220 = QOpenGLContext::getProcAddress(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  if (local_220 == (QFunctionPointer)0x0) {
    memset(local_208,0xaa,0x200);
    __n = strlen(in_RSI);
    memcpy(local_208,in_RSI,__n);
    this = (anon_struct_16_2_62e3e2f5 *)&QOpenGLFunctionsPrivateEx::vtable;
    for (local_240 = getProcAddress::extensions; local_240 != this; local_240 = local_240 + 1) {
      procName = local_240;
      memcpy(local_208 + __n,*(void **)&local_240->name,(long)local_240->len);
      local_220 = QOpenGLContext::getProcAddress((QOpenGLContext *)this,(char *)procName);
      if (local_220 != (QFunctionPointer)0x0) break;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_220;
}

Assistant:

static QFunctionPointer getProcAddress(QOpenGLContext *context, const char *funcName)
{
    QFunctionPointer function = context->getProcAddress(funcName);

    static const struct {
        const char *name;
        int len; // includes trailing \0
    } extensions[] = {
        { "ARB", 4 },
        { "OES", 4 },
        { "EXT", 4 },
        { "ANGLE", 6 },
        { "NV", 3 },
    };

    if (!function) {
        char fn[512];
        size_t size = strlen(funcName);
        Q_ASSERT(size < 500);
        memcpy(fn, funcName, size);
        char *ext = fn + size;

        for (const auto &e : extensions) {
            memcpy(ext, e.name, e.len);
            function = context->getProcAddress(fn);
            if (function)
                break;
        }
    }

    return function;
}